

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ORForest.cpp
# Opt level: O2

void __thiscall RandomForest::ORForest<float>::ORForest(ORForest<float> *this)

{
  __shared_ptr<std::vector<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  local_28;
  
  (this->trainData).
  super___shared_ptr<std::vector<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->testData).
  super___shared_ptr<std::vector<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->trees).
  super__Vector_base<RandomForest::ODTree<float>,_std::allocator<RandomForest::ODTree<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->trainData).
  super___shared_ptr<std::vector<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->trees).
  super__Vector_base<RandomForest::ODTree<float>,_std::allocator<RandomForest::ODTree<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->trees).
  super__Vector_base<RandomForest::ODTree<float>,_std::allocator<RandomForest::ODTree<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->testData).
  super___shared_ptr<std::vector<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->treeNumber = 0x14;
  this->maxDepth = 10;
  this->leastNsample = 10;
  local_28._M_ptr = (element_type *)0x0;
  local_28._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  __shared_ptr<std::vector<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ::operator=(&(this->trainData).
               super___shared_ptr<std::vector<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ,&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  local_28._M_ptr = (element_type *)0x0;
  local_28._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  __shared_ptr<std::vector<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ::operator=(&(this->testData).
               super___shared_ptr<std::vector<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_std::allocator<std::shared_ptr<std::vector<float,_std::allocator<float>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ,&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  this->testDataRatio = 0.3;
  this->balanceType = SingleParameterBoostrap;
  this->samplingType = DownSamplingMajority;
  this->onlineUpdate = true;
  return;
}

Assistant:

RandomForest::ORForest<T>::ORForest()
{
	treeNumber=20;
	maxDepth=10;
	leastNsample=10;
    trainData=nullptr;;
    testData=nullptr;
    testDataRatio=0.3;
    balanceType=SingleParameterBoostrap;
    samplingType=DownSamplingMajority;
    onlineUpdate=true;
}